

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int fffrwc(fitsfile *fptr,char *expr,char *timeCol,char *parCol,char *valCol,long ntimes,
          double *times,char *time_status,int *status)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  bool bVar4;
  undefined1 local_230 [8];
  ParseData lParse;
  long lStack_140;
  char result;
  long elem;
  long naxes [5];
  long local_108;
  long nelem;
  uint local_f8;
  int nCol;
  int constant;
  int naxis;
  int typecode;
  int parNo;
  long width;
  long alen;
  parseInfo Info;
  long ntimes_local;
  char *valCol_local;
  char *parCol_local;
  char *timeCol_local;
  char *expr_local;
  fitsfile *fptr_local;
  
  nelem._4_4_ = 0;
  if (*status == 0) {
    Info.parseVariables.zeros[3] = ntimes;
    memset(&alen,0,0x90);
    iVar2 = ffiprs(fptr,1,expr,5,(int *)&alen,&local_108,&nCol,&elem,(ParseData *)local_230,status);
    if (iVar2 == 0) {
      ffgcno(fptr,0,timeCol,(int *)((long)&lParse.loadData + 4),status);
      ffgcno(fptr,0,parCol,&lParse.compressed,status);
      ffgcno(fptr,0,valCol,&lParse.timeCol,status);
      if (*status == 0) {
        bVar4 = local_108 < 0;
        if (bVar4) {
          local_108 = -local_108;
          nelem._4_4_ = (int)lParse.nRows;
          lParse.nRows._0_4_ = 0;
        }
        local_f8 = (uint)bVar4;
        if (((int)alen == 0xe) && (local_108 == 1)) {
          naxis = (int)lParse.nRows;
          do {
            iVar2 = naxis + -1;
            if (naxis == 0) {
              naxis = iVar2;
              iVar2 = fits_uncompress_hkdata
                                ((ParseData *)local_230,fptr,Info.parseVariables.zeros[3],times,
                                 status);
              if (iVar2 == 0) {
                if (local_f8 == 0) {
                  Info._0_8_ = time_status;
                  Info.dataPtr = (void *)0x0;
                  Info.nullPtr = (void *)Info.parseVariables.zeros[3];
                  iVar2 = fits_parser_workfn(Info.parseVariables.zeros[3],0,1,
                                             Info.parseVariables.zeros[3],(int)lParse.nRows,
                                             (iteratorCol *)lParse.nAxes[4],&alen);
                  *status = iVar2;
                }
                else {
                  lParse._231_1_ = *(char *)(lParse._48_8_ + (long)lParse.nNodes * 0x180 + 0x80);
                  lStack_140 = Info.parseVariables.zeros[3];
                  while (lStack_140 != 0) {
                    time_status[lStack_140 + -1] = lParse._231_1_;
                    lStack_140 = lStack_140 + -1;
                  }
                }
              }
              naxis = (int)lParse.nRows;
              while (iVar2 = naxis + -1, naxis != 0) {
                naxis = iVar2;
                if (*(int *)(lParse.nAxes[4] + (long)iVar2 * 0x110 + 0x54) == 0x10) {
                  if (**(long **)(lParse.nAxes[4] + (long)iVar2 * 0x110 + 0x60) == 0) {
                    printf("invalid free(((char **)lParse.colData[parNo].array)[0]) at %s:%d\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                           ,0x7f7);
                  }
                  else {
                    free((void *)**(undefined8 **)(lParse.nAxes[4] + (long)iVar2 * 0x110 + 0x60));
                  }
                }
                if (*(long *)(lParse.nAxes[4] + (long)naxis * 0x110 + 0x60) == 0) {
                  printf("invalid free(lParse.colData[parNo].array) at %s:%d\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                         ,0x7f8);
                }
                else {
                  free(*(void **)(lParse.nAxes[4] + (long)naxis * 0x110 + 0x60));
                }
              }
              if (local_f8 != 0) {
                lParse.nRows._0_4_ = nelem._4_4_;
              }
              naxis = iVar2;
              ffcprs((ParseData *)local_230);
              return *status;
            }
            iVar1 = *(int *)(lParse.nAxes[4] + 0x54 + (long)iVar2 * 0x110);
            if (iVar1 == 0x10) {
              naxis = iVar2;
              iVar2 = ffgtcl(fptr,lParse.timeCol,&constant,&width,(long *)&typecode,status);
              if (iVar2 == 0) {
                width = width + 1;
                pvVar3 = malloc((Info.parseVariables.zeros[3] + 1) * 8);
                *(void **)(lParse.nAxes[4] + (long)naxis * 0x110 + 0x60) = pvVar3;
                if (pvVar3 == (void *)0x0) {
                  *status = 0x71;
                }
                else {
                  pvVar3 = malloc((Info.parseVariables.zeros[3] + 1) * width);
                  **(undefined8 **)(lParse.nAxes[4] + (long)naxis * 0x110 + 0x60) = pvVar3;
                  if (pvVar3 == (void *)0x0) {
                    free(*(void **)(lParse.nAxes[4] + (long)naxis * 0x110 + 0x60));
                    *status = 0x71;
                  }
                  else {
                    for (lStack_140 = 1; lStack_140 <= Info.parseVariables.zeros[3];
                        lStack_140 = lStack_140 + 1) {
                      *(long *)(*(long *)(lParse.nAxes[4] + (long)naxis * 0x110 + 0x60) +
                               lStack_140 * 8) =
                           *(long *)(*(long *)(lParse.nAxes[4] + (long)naxis * 0x110 + 0x60) +
                                    (lStack_140 + -1) * 8) + width;
                    }
                    *(undefined1 *)**(undefined8 **)(lParse.nAxes[4] + (long)naxis * 0x110 + 0x60) =
                         0;
                  }
                }
              }
            }
            else if (iVar1 == 0x29) {
              naxis = iVar2;
              pvVar3 = malloc((Info.parseVariables.zeros[3] + 1) * 8);
              *(void **)(lParse.nAxes[4] + (long)naxis * 0x110 + 0x60) = pvVar3;
              if (pvVar3 == (void *)0x0) {
                *status = 0x71;
              }
              else {
                **(undefined8 **)(lParse.nAxes[4] + (long)naxis * 0x110 + 0x60) = 0x4995cdd1;
              }
            }
            else {
              naxis = iVar2;
              if (iVar1 == 0x52) {
                pvVar3 = malloc((Info.parseVariables.zeros[3] + 1) * 8);
                *(void **)(lParse.nAxes[4] + (long)naxis * 0x110 + 0x60) = pvVar3;
                if (pvVar3 == (void *)0x0) {
                  *status = 0x71;
                }
                else {
                  **(undefined8 **)(lParse.nAxes[4] + (long)naxis * 0x110 + 0x60) =
                       0xb8a83e285ebab4b7;
                }
              }
            }
          } while (*status == 0);
          while (iVar2 = naxis + -1, naxis != 0) {
            naxis = iVar2;
            if (*(int *)(lParse.nAxes[4] + (long)iVar2 * 0x110 + 0x54) == 0x10) {
              if (**(long **)(lParse.nAxes[4] + (long)iVar2 * 0x110 + 0x60) == 0) {
                printf("invalid free(((char **)lParse.colData[parNo].array)[0]) at %s:%d\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                       ,0x7d7);
              }
              else {
                free((void *)**(undefined8 **)(lParse.nAxes[4] + (long)iVar2 * 0x110 + 0x60));
              }
            }
            if (*(long *)(lParse.nAxes[4] + (long)naxis * 0x110 + 0x60) == 0) {
              printf("invalid free(lParse.colData[parNo].array) at %s:%d\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                     ,0x7d8);
            }
            else {
              free(*(void **)(lParse.nAxes[4] + (long)naxis * 0x110 + 0x60));
            }
          }
          fptr_local._4_4_ = *status;
        }
        else {
          ffcprs((ParseData *)local_230);
          ffpmsg("Expression does not evaluate to a logical scalar.");
          *status = 0x1b0;
          fptr_local._4_4_ = 0x1b0;
        }
      }
      else {
        fptr_local._4_4_ = *status;
      }
    }
    else {
      ffcprs((ParseData *)local_230);
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int fffrwc( fitsfile *fptr,        /* I - Input FITS file                    */
            char     *expr,        /* I - Boolean expression                 */
            char     *timeCol,     /* I - Name of time column                */
            char     *parCol,      /* I - Name of parameter column           */
            char     *valCol,      /* I - Name of value column               */
            long     ntimes,       /* I - Number of distinct times in file   */
            double   *times,       /* O - Array of times in file             */
            char     *time_status, /* O - Array of boolean results           */
            int      *status )     /* O - Error status                       */
/*                                                                           */
/* Evaluate a boolean expression for each time in a compressed file,         */
/* returning an array of flags indicating which times evaluated to TRUE/FALSE*/
/*---------------------------------------------------------------------------*/
{
   parseInfo Info;
   long alen, width;
   int parNo, typecode;
   int naxis, constant, nCol=0;
   long nelem, naxes[MAXDIMS], elem;
   char result;
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   

   if( ffiprs( fptr, 1, expr, MAXDIMS, &Info.datatype, &nelem,
               &naxis, naxes, &lParse, status ) ) {
      ffcprs(&lParse);
      return( *status );
   }

   fits_get_colnum( fptr, CASEINSEN, timeCol, &lParse.timeCol, status );
   fits_get_colnum( fptr, CASEINSEN, parCol,  &lParse.parCol , status );
   fits_get_colnum( fptr, CASEINSEN, valCol,  &lParse.valCol, status );
   if( *status ) return( *status );
   
   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
      nCol = lParse.nCols;
      lParse.nCols = 0;    /*  Ignore all column references  */
   } else
      constant = 0;

   if( Info.datatype!=TLOGICAL || nelem!=1 ) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      return( *status = PARSE_BAD_TYPE );
   }

   /*******************************************/
   /* Allocate data arrays for each parameter */
   /*******************************************/
   
   parNo = lParse.nCols;
   while( parNo-- ) {
      switch( lParse.colData[parNo].datatype ) {
      case TLONG:
         if( (lParse.colData[parNo].array =
              (long *)malloc( (ntimes+1)*sizeof(long) )) )
            ((long*)lParse.colData[parNo].array)[0] = 1234554321;
         else
            *status = MEMORY_ALLOCATION;
         break;
      case TDOUBLE:
         if( (lParse.colData[parNo].array =
              (double *)malloc( (ntimes+1)*sizeof(double) )) )
            ((double*)lParse.colData[parNo].array)[0] = DOUBLENULLVALUE;
         else
            *status = MEMORY_ALLOCATION;
         break;
      case TSTRING:
         if( !fits_get_coltype( fptr, lParse.valCol, &typecode,
                                &alen, &width, status ) ) {
            alen++;
            if( (lParse.colData[parNo].array =
                 (char **)malloc( (ntimes+1)*sizeof(char*) )) ) {
               if( (((char **)lParse.colData[parNo].array)[0] =
                    (char *)malloc( (ntimes+1)*sizeof(char)*alen )) ) {
                  for( elem=1; elem<=ntimes; elem++ )
                     ((char **)lParse.colData[parNo].array)[elem] =
                        ((char **)lParse.colData[parNo].array)[elem-1]+alen;
                  ((char **)lParse.colData[parNo].array)[0][0] = '\0';
               } else {
                  free( lParse.colData[parNo].array );
                  *status = MEMORY_ALLOCATION;
               }
            } else {
               *status = MEMORY_ALLOCATION;
            }
         }
         break;
      }
      if( *status ) {
         while( parNo-- ) {
            if( lParse.colData[parNo].datatype==TSTRING )
               FREE( ((char **)lParse.colData[parNo].array)[0] );
            FREE( lParse.colData[parNo].array );
         }
         return( *status );
      }
   }
   
   /**********************************************************************/
   /* Read data from columns needed for the expression and then parse it */
   /**********************************************************************/
   
   if( !fits_uncompress_hkdata( &lParse, fptr, ntimes, times, status ) ) {
      if( constant ) {
         result = lParse.Nodes[lParse.resultNode].value.data.log;
         elem = ntimes;
         while( elem-- ) time_status[elem] = result;
      } else {
         Info.dataPtr  = time_status;
         Info.nullPtr  = NULL;
         Info.maxRows  = ntimes;
         *status       = fits_parser_workfn( ntimes, 0, 1, ntimes, lParse.nCols,
                                     lParse.colData, (void*)&Info );
      }
   }
   
   /************/
   /* Clean up */
   /************/
   
   parNo = lParse.nCols;
   while ( parNo-- ) {
      if( lParse.colData[parNo].datatype==TSTRING )
         FREE( ((char **)lParse.colData[parNo].array)[0] );
      FREE( lParse.colData[parNo].array );
   }
   
   if( constant ) lParse.nCols = nCol;

   ffcprs(&lParse);
   return(*status);
}